

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tools.cpp
# Opt level: O2

void __thiscall miniros::network::HttpFrame::finishReqeust(HttpFrame *this)

{
  uint uVar1;
  size_type sVar2;
  pointer pcVar3;
  ulong uVar4;
  string newData;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  if (this->m_state == ParseComplete) {
    uVar1 = this->m_contentLength;
    sVar2 = (this->data)._M_string_length;
    if (sVar2 != (long)(int)uVar1) {
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      pcVar3 = (this->data)._M_dataplus._M_p;
      local_30[0] = local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_30,pcVar3 + uVar4 + (long)this->m_bodyPosition,pcVar3 + sVar2);
      std::__cxx11::string::swap((string *)this);
      std::__cxx11::string::~string((string *)local_30);
      goto LAB_0022a172;
    }
  }
  (this->data)._M_string_length = 0;
  *(this->data)._M_dataplus._M_p = '\0';
LAB_0022a172:
  resetParseState(this);
  return;
}

Assistant:

void HttpFrame::finishReqeust()
{
  if (m_state == ParseComplete) {
    size_t currentLength = m_bodyPosition;
    if (m_contentLength >= 0)
      currentLength += m_contentLength;
    if (m_contentLength  == data.size()) {
      data.clear();
    } else {
      // Truncate all data related to current request
      std::string newData(data.data() + currentLength, data.size() - currentLength);
      std::swap(data, newData);
    }
  } else {
    data.clear();
  }
  resetParseState();
}